

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O0

bool __thiscall cmTestGenerator::NeedsScriptNoConfig(cmTestGenerator *this)

{
  bool bVar1;
  byte local_11;
  cmTestGenerator *this_local;
  
  local_11 = 0;
  if (((this->TestGenerated & 1U) != 0) &&
     (local_11 = 0, ((this->super_cmScriptGenerator).ActionsPerConfig & 1U) != 0)) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&(this->super_cmScriptGenerator).Configurations);
    local_11 = 0;
    if (bVar1) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((this->super_cmScriptGenerator).ConfigurationTypes);
      local_11 = bVar1 ^ 0xff;
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool cmTestGenerator::NeedsScriptNoConfig() const
{
  return (this->TestGenerated && // test generated for at least one config
          this->ActionsPerConfig && // test is config-aware
          this->Configurations.empty() && // test runs in all configs
          !this->ConfigurationTypes->empty()); // config-dependent command
}